

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

JavascriptPromiseAllSettledResolveOrRejectElementFunction * __thiscall
Js::JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction
          (JavascriptLibrary *this,JavascriptMethod entryPoint,uint32 index,JavascriptArray *values,
          JavascriptPromiseCapability *capabilities,
          JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *remainingElements,
          JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyCalledWrapper,
          bool isRejecting)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  DynamicType *type;
  Recycler *this_00;
  undefined4 *puVar4;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *this_01;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  data._32_8_ = remainingElements;
  type = DynamicType::New((this->super_JavascriptLibraryBase).scriptContext.ptr,TypeIds_Function,
                          &((this->super_JavascriptLibraryBase).functionPrototype.ptr)->
                           super_RecyclableObject,entryPoint,
                          (DynamicTypeHandler *)
                          &DeferredTypeHandler<&(bool_Js::JavascriptLibrary::InitializeFunction<false,false,false,false>(Js::DynamicObject*,Js::DeferredTypeHandlerBase*,Js::DeferredInitializeMode)),Js::InitializeFunctionDeferredTypeHandlerFilter<false,false,false>,false,(unsigned_short)0,(unsigned_short)0>
                           ::defaultInstance,false,false);
  local_68 = (undefined1  [8])&JavascriptPromiseAllSettledResolveOrRejectElementFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_765c5cc;
  data.filename._0_4_ = 0x1a11;
  this_00 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_68);
  BVar3 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar2) goto LAB_00bed84e;
    *puVar4 = 0;
  }
  this_01 = (JavascriptPromiseAllSettledResolveOrRejectElementFunction *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                      (this_00,0x78);
  if (this_01 == (JavascriptPromiseAllSettledResolveOrRejectElementFunction *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                ,0xa70,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
LAB_00bed84e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  JavascriptPromiseAllSettledResolveOrRejectElementFunction::
  JavascriptPromiseAllSettledResolveOrRejectElementFunction
            (this_01,type,
             (FunctionInfo *)JavascriptPromise::EntryInfo::AllSettledResolveOrRejectElementFunction,
             index,values,capabilities,
             (JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *)data._32_8_,
             alreadyCalledWrapper,isRejecting);
  (**(code **)((long)(this_01->super_JavascriptPromiseAllResolveElementFunction).
                     super_RuntimeFunction.super_JavascriptFunction.super_DynamicObject.
                     super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject +
              0xf0))(this_01,0xd1,&DAT_1000000000001,2,0,0,0xf);
  return this_01;
}

Assistant:

JavascriptPromiseAllSettledResolveOrRejectElementFunction* JavascriptLibrary::CreatePromiseAllSettledResolveOrRejectElementFunction(JavascriptMethod entryPoint, uint32 index, JavascriptArray* values, JavascriptPromiseCapability* capabilities, JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper* remainingElements, JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyCalledWrapper, bool isRejecting)
    {
        FunctionInfo* functionInfo = &Js::JavascriptPromise::EntryInfo::AllSettledResolveOrRejectElementFunction;
        DynamicType* type = DynamicType::New(scriptContext, TypeIds_Function, functionPrototype, entryPoint, GetDeferredAnonymousFunctionTypeHandler());
        JavascriptPromiseAllSettledResolveOrRejectElementFunction* function = RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, JavascriptPromiseAllSettledResolveOrRejectElementFunction, type, functionInfo, index, values, capabilities, remainingElements, alreadyCalledWrapper, isRejecting);

        function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable, nullptr);

        return function;
    }